

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_attention.h
# Opt level: O1

longlong __thiscall
shift_window_transformer::WindowAttention<float>::parameterCount(WindowAttention<float> *this)

{
  Tensor<float> *pTVar1;
  Tensor<int> *pTVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  if (this->cyclicShift == (CyclicShift<float> *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = (**(code **)(*(long *)this->cyclicShift + 8))();
  }
  if (this->cyclicBackShift != (CyclicShift<float> *)0x0) {
    lVar5 = (**(code **)(*(long *)this->cyclicBackShift + 8))();
    lVar4 = lVar4 + lVar5;
  }
  if (this->qLinear != (Linear<float> *)0x0) {
    iVar3 = (*(this->qLinear->super_Layer<float>)._vptr_Layer[1])();
    lVar4 = lVar4 + CONCAT44(extraout_var,iVar3);
  }
  if (this->kLinear != (Linear<float> *)0x0) {
    iVar3 = (*(this->kLinear->super_Layer<float>)._vptr_Layer[1])();
    lVar4 = lVar4 + CONCAT44(extraout_var_00,iVar3);
  }
  if (this->vLinear != (Linear<float> *)0x0) {
    iVar3 = (*(this->vLinear->super_Layer<float>)._vptr_Layer[1])();
    lVar4 = lVar4 + CONCAT44(extraout_var_01,iVar3);
  }
  if (this->outLinear != (Linear<float> *)0x0) {
    iVar3 = (*(this->outLinear->super_Layer<float>)._vptr_Layer[1])();
    lVar4 = lVar4 + CONCAT44(extraout_var_02,iVar3);
  }
  pTVar1 = this->upperLowerMask;
  if (pTVar1 != (Tensor<float> *)0x0) {
    lVar4 = lVar4 + ((long)(pTVar1->super_vector<float,_std::allocator<float>_>).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pTVar1->super_vector<float,_std::allocator<float>_>).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
  }
  pTVar1 = this->leftRightMask;
  if (pTVar1 != (Tensor<float> *)0x0) {
    lVar4 = lVar4 + ((long)(pTVar1->super_vector<float,_std::allocator<float>_>).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pTVar1->super_vector<float,_std::allocator<float>_>).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
  }
  pTVar2 = this->relativeIndices;
  if (pTVar2 != (Tensor<int> *)0x0) {
    lVar4 = lVar4 + ((long)(pTVar2->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pTVar2->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
  }
  pTVar1 = this->posEmbedding;
  if (pTVar1 != (Tensor<float> *)0x0) {
    lVar4 = lVar4 + ((long)(pTVar1->super_vector<float,_std::allocator<float>_>).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pTVar1->super_vector<float,_std::allocator<float>_>).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
  }
  return lVar4;
}

Assistant:

long long parameterCount() {
            long long ret = 0;
            if (cyclicShift != nullptr) ret += cyclicShift->parameterCount();
            if (cyclicBackShift != nullptr) ret += cyclicBackShift->parameterCount();
            if (qLinear != nullptr) ret += qLinear->parameterCount();
            if (kLinear != nullptr) ret += kLinear->parameterCount();
            if (vLinear != nullptr) ret += vLinear->parameterCount();
            if (outLinear != nullptr) ret += outLinear->parameterCount();
            if (upperLowerMask != nullptr) ret += upperLowerMask->size();
            if (leftRightMask != nullptr) ret += leftRightMask->size();
            if (relativeIndices != nullptr) ret += relativeIndices->size();
            if (posEmbedding != nullptr) ret += posEmbedding->size();
            ret += softMax.parameterCount();
            return ret;
        }